

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

int __thiscall Catch::Session::runInternal(Session *this)

{
  size_type *psVar1;
  const_iterator __position;
  undefined8 *puVar2;
  pointer this_00;
  _func_int **pp_Var3;
  TestCase **ppTVar4;
  pointer pTVar5;
  _Head_base<0UL,_Catch::IStreamingReporter_*,_false> _Var6;
  shared_ptr<Catch::Config> *psVar7;
  undefined8 uVar8;
  ulong uVar9;
  undefined4 total_tests;
  int iVar10;
  int iVar11;
  int iVar12;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar13;
  undefined4 extraout_var;
  long *plVar14;
  long lVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  ConfigData *pCVar17;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  TestSpec *this_01;
  long lVar18;
  _Base_ptr p_Var19;
  char *pcVar20;
  ostream *poVar21;
  FilterMatch *match_1;
  pointer *__x;
  element_type *peVar22;
  _Head_base<0UL,_Catch::IStreamingReporter_*,_false> _Var23;
  int iVar24;
  iterator __begin3;
  element_type *peVar25;
  undefined8 *puVar26;
  TestCase *test;
  TestCase **__v;
  pointer pTVar27;
  undefined1 auVar28 [12];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  Totals totals;
  string filename;
  undefined1 local_410 [32];
  vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
  *local_3f0;
  undefined1 local_3e8 [32];
  _Head_base<0UL,_Catch::IStreamingReporter_*,_false> local_3c8;
  shared_ptr<Catch::Config> *local_3c0;
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [96];
  Totals local_348;
  undefined1 local_2d0 [240];
  long *local_1e0;
  ulong local_1b8;
  long *local_160;
  undefined1 local_78 [64];
  _Alloc_hider _Stack_38;
  
  if (this->m_startupExceptions != false) {
    return 1;
  }
  if ((this->m_configData).showHelp != false) {
    return 0;
  }
  if ((this->m_configData).libIdentify != false) {
    return 0;
  }
  config(this);
  seedRng(&((this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_IConfig);
  local_3c0 = &this->m_config;
  if ((this->m_configData).filenamesAsTags == true) {
    peVar25 = (local_3c0->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pSVar13 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
              ::getInternal();
    iVar10 = (*(pSVar13->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar13);
    plVar14 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar10) + 0x18))
                                ((long *)CONCAT44(extraout_var,iVar10),peVar25);
    lVar18 = plVar14[1];
    if (*plVar14 != lVar18) {
      __x = (pointer *)(*plVar14 + 0x60);
      do {
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_3b8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)__x);
        std::__cxx11::string::string
                  ((string *)local_2d0,
                   (char *)(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)(__x + 6))->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,(allocator *)local_410);
        lVar15 = std::__cxx11::string::find_last_of((char *)local_2d0,0x181ec9,0xffffffffffffffff);
        if (lVar15 != -1) {
          std::__cxx11::string::erase((ulong)local_2d0,0);
          *(char *)local_2d0._0_8_ = '#';
        }
        p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  std::__cxx11::string::rfind
                            ((char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_2d0,0x2e);
        if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff) {
          if ((ulong)local_2d0._8_8_ < p_Var16) {
            auVar28 = std::__throw_out_of_range_fmt
                                ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                                 "basic_string::erase",p_Var16);
            if ((element_type *)local_3b8._8_8_ != (element_type *)0x0) {
              clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_);
            }
            if ((pointer)local_348.skippedTests != (pointer)0x0) {
              clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348.skippedTests);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d0._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d0._8_8_);
            }
            if (auVar28._8_4_ == 1) {
              plVar14 = (long *)__cxa_begin_catch(auVar28._0_8_);
              pcVar20 = (char *)(**(code **)(*plVar14 + 0x10))(plVar14);
              poVar21 = std::operator<<((ostream *)&std::cerr,pcVar20);
              std::endl<char,std::char_traits<char>>(poVar21);
              __cxa_end_catch();
              return 0xff;
            }
            _Unwind_Resume(auVar28._0_8_);
          }
          *(char *)(local_2d0._0_8_ + (long)p_Var16) = '\0';
          local_2d0._8_8_ = p_Var16;
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_348,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_3b8);
        setTags((TestCaseInfo *)(__x + -0xc),
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_348);
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_348);
        if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
          operator_delete((void *)local_2d0._0_8_);
        }
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_3b8);
        lVar15 = (long)(__x + 0xb);
        __x = __x + 0x17;
      } while (lVar15 != lVar18);
    }
  }
  list((Catch *)local_2d0,local_3c0);
  if ((int *)local_2d0._0_8_ != (int *)0x0) {
    return *(int *)local_2d0._0_8_;
  }
  local_2d0._0_8_ =
       (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_2d0._8_8_ =
       (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  local_348._0_8_ = local_2d0._0_8_;
  if ((element_type *)local_2d0._8_8_ == (element_type *)0x0) {
    local_348.skippedTests = 0;
    goto LAB_00126c6d;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    *(int *)&((element_type *)local_2d0._8_8_)->m_data =
         *(int *)&((element_type *)local_2d0._8_8_)->m_data + 1;
    UNLOCK();
    local_348._0_8_ =
         (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_348.skippedTests =
         (size_t)(this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
    if ((element_type *)local_348.skippedTests == (element_type *)0x0) goto LAB_00126c6d;
    pCVar17 = &((element_type *)local_348.skippedTests)->m_data;
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)pCVar17 = *(int *)pCVar17 + 1;
      UNLOCK();
      goto LAB_00126c6d;
    }
  }
  else {
    *(int *)&((element_type *)local_2d0._8_8_)->m_data =
         *(int *)&((element_type *)local_2d0._8_8_)->m_data + 1;
    pCVar17 = &((element_type *)local_2d0._8_8_)->m_data;
    local_348.skippedTests = local_2d0._8_8_;
  }
  *(int *)pCVar17 = *(int *)pCVar17 + 1;
LAB_00126c6d:
  pSVar13 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
            ::getInternal();
  iVar10 = (*(pSVar13->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar13);
  plVar14 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar10) + 0x20))
                              ((long *)CONCAT44(extraout_var_00,iVar10));
  if (*plVar14 == plVar14[1]) {
    local_3b8._0_8_ =
         (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_3b8._8_8_ =
         (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_)->_M_use_count + 1;
      }
    }
    anon_unknown_1::createReporter
              ((anon_unknown_1 *)local_3e8,&(((element_type *)local_3b8._0_8_)->m_data).reporterName
               ,(IConfigPtr *)local_3b8);
  }
  else {
    local_3e8._0_8_ = operator_new(0x30);
    *(undefined ***)local_3e8._0_8_ = &PTR__ListeningReporter_001b0668;
    ((IStreamingReporter *)(local_3e8._0_8_ + 8))->_vptr_IStreamingReporter = (_func_int **)0x0;
    ((IStreamingReporter *)(local_3e8._0_8_ + 0x10))->_vptr_IStreamingReporter = (_func_int **)0x0;
    ((IStreamingReporter *)(local_3e8._0_8_ + 0x18))->_vptr_IStreamingReporter = (_func_int **)0x0;
    ((IStreamingReporter *)(local_3e8._0_8_ + 0x20))->_vptr_IStreamingReporter = (_func_int **)0x0;
    *(undefined2 *)&((IStreamingReporter *)(local_3e8._0_8_ + 0x28))->_vptr_IStreamingReporter =
         0x100;
    local_3c8._M_head_impl = (IStreamingReporter *)local_3e8._0_8_;
    pSVar13 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
              ::getInternal();
    iVar10 = (*(pSVar13->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar13);
    plVar14 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar10) + 0x20))
                                ((long *)CONCAT44(extraout_var_01,iVar10));
    puVar26 = (undefined8 *)*plVar14;
    puVar2 = (undefined8 *)plVar14[1];
    if (puVar26 != puVar2) {
      local_3f0 = (vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
                   *)((long)local_3c8._M_head_impl + 8);
      do {
        plVar14 = (long *)*puVar26;
        peVar25 = (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        this_00 = (pointer)(this->m_config).
                           super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                           ._M_pi;
        if (this_00 != (pointer)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            psVar1 = &(this_00->name)._M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
            UNLOCK();
          }
          else {
            psVar1 = &(this_00->name)._M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
          }
        }
        iVar10 = (*(peVar25->super_IConfig).super_NonCopyable._vptr_NonCopyable[3])(peVar25);
        local_3b8._0_8_ = CONCAT44(extraout_var_02,iVar10);
        if (this_00 != (pointer)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            psVar1 = &(this_00->name)._M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
            UNLOCK();
          }
          else {
            psVar1 = &(this_00->name)._M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
          }
        }
        local_3b8._8_8_ = peVar25;
        local_3a8._0_8_ = this_00;
        (**(code **)(*plVar14 + 0x10))
                  ((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                    *)local_410,plVar14,local_3b8);
        std::
        vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
        ::
        emplace_back<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>
                  (local_3f0,
                   (unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                    *)local_410);
        if ((_Head_base<0UL,_Catch::IStreamingReporter_*,_false>)local_410._0_8_ !=
            (_Head_base<0UL,_Catch::IStreamingReporter_*,_false>)0x0) {
          (*(*(_func_int ***)local_410._0_8_)[1])();
        }
        local_410._0_8_ = (IStreamingReporter *)0x0;
        if ((pointer)local_3a8._0_8_ != (pointer)0x0) {
          clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a8._0_8_);
        }
        if (this_00 != (pointer)0x0) {
          clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
        }
        puVar26 = puVar26 + 2;
      } while (puVar26 != puVar2);
    }
    _Var6._M_head_impl = local_3c8._M_head_impl;
    local_3b8._0_8_ =
         (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_3b8._8_8_ =
         (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_)->_M_use_count + 1;
      }
    }
    anon_unknown_1::createReporter
              ((anon_unknown_1 *)local_410,&(((element_type *)local_3b8._0_8_)->m_data).reporterName
               ,(IConfigPtr *)local_3b8);
    _Var23._M_head_impl = (IStreamingReporter *)local_410._0_8_;
    local_410._0_8_ = (IStreamingReporter *)0x0;
    pp_Var3 = _Var6._M_head_impl[4]._vptr_IStreamingReporter;
    _Var6._M_head_impl[4]._vptr_IStreamingReporter = (_func_int **)_Var23._M_head_impl;
    if (pp_Var3 != (_func_int **)0x0) {
      (**(code **)(*pp_Var3 + 8))(pp_Var3);
      _Var23._M_head_impl = (IStreamingReporter *)_Var6._M_head_impl[4]._vptr_IStreamingReporter;
    }
    iVar10 = (*(_Var23._M_head_impl)->_vptr_IStreamingReporter[2])();
    *(byte *)&_Var6._M_head_impl[5]._vptr_IStreamingReporter = (byte)iVar10 & 1;
    if ((_Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
         )local_410._0_8_ != (IStreamingReporter *)0x0) {
      (**(code **)(*(long *)local_410._0_8_ + 8))();
    }
    local_410._0_8_ =
         (__uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
          )0x0;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_);
  }
  RunContext::RunContext
            ((RunContext *)(local_2d0 + 0x10),(IConfigPtr *)&local_348,
             (IStreamingReporterPtr *)local_3e8);
  if ((IStreamingReporter *)local_3e8._0_8_ != (IStreamingReporter *)0x0) {
    (*(*(_func_int ***)local_3e8._0_8_)[1])();
  }
  if ((element_type *)local_348.skippedTests != (element_type *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348.skippedTests);
  }
  uVar8 = local_2d0._0_8_;
  __position._M_node = (_Base_ptr)(local_78 + 8);
  local_78._8_4_ = _S_red;
  local_78._16_8_ = 0;
  local_78._40_8_ = 0;
  local_78._48_8_ = (pointer)0x0;
  local_78._56_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Stack_38._M_p = (pointer)0x0;
  local_78._24_8_ = __position._M_node;
  local_78._32_8_ = __position._M_node;
  pSVar13 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
            ::getInternal();
  iVar10 = (*(pSVar13->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar13);
  testCases = (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar10) + 0x18))
                        ((long *)CONCAT44(extraout_var_03,iVar10),uVar8);
  this_01 = (TestSpec *)(**(code **)(*(long *)local_2d0._0_8_ + 0x68))();
  TestSpec::matchesByFilter((Matches *)&local_348,this_01,testCases,(IConfig *)local_2d0._0_8_);
  local_3a8._0_8_ = _Stack_38._M_p;
  local_3b8._8_8_ = local_78._56_8_;
  local_3b8._0_8_ = local_78._48_8_;
  _Stack_38._M_p = (pointer)local_348.assertions.passed;
  local_78._48_8_ = local_348._0_8_;
  local_78._56_8_ = local_348.skippedTests;
  local_348._0_8_ = (pointer)0x0;
  local_348.skippedTests = 0;
  local_348.assertions.passed = 0;
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
          local_3b8);
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
          &local_348);
  lVar18 = (**(code **)(*(long *)local_2d0._0_8_ + 0x68))();
  uVar8 = local_78._56_8_;
  if (local_78._48_8_ == local_78._56_8_) {
    if (*(long *)(lVar18 + 0x18) == *(long *)(lVar18 + 0x20)) {
      pTVar27 = (testCases->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pTVar5 = (testCases->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (pTVar27 != pTVar5) {
        do {
          if (((pTVar27->super_TestCaseInfo).properties & IsHidden) == None) {
            local_3b8._0_8_ = pTVar27;
            std::
            _Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
            ::_M_emplace_unique<Catch::TestCase_const*>
                      ((_Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
                        *)local_78,(TestCase **)local_3b8);
          }
          pTVar27 = pTVar27 + 1;
        } while (pTVar27 != pTVar5);
      }
    }
  }
  else {
    peVar25 = (element_type *)local_78._48_8_;
    do {
      ppTVar4 = *(TestCase ***)&(peVar25->m_data).endOffsetPercentage;
      local_3b8._0_8_ = local_78;
      for (__v = *(TestCase ***)&(peVar25->m_data).startOffsetPercentage; __v != ppTVar4;
          __v = __v + 1) {
        std::
        _Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
        ::
        _M_insert_unique_<Catch::TestCase_const*const&,std::_Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>::_Alloc_node>
                  ((_Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
                    *)local_78,__position,__v,(_Alloc_node *)local_3b8);
      }
      peVar25 = (element_type *)&(peVar25->m_data).benchmarkConfidenceInterval;
    } while (peVar25 != (element_type *)uVar8);
  }
  lVar18 = (**(code **)(*(long *)local_2d0._0_8_ + 0x68))();
  local_348.skippedTestReasons._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_348.skippedTestReasons._M_t._M_impl.super__Rb_tree_header._M_header;
  local_348._0_8_ = local_348._0_8_ & 0xffffffff00000000;
  local_348.skippedTestReasons._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_348.skippedTestReasons._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_348.skippedTests = 0;
  local_348.assertions.passed = 0;
  local_348.assertions.failed = 0;
  local_348.assertions.failedButOk = 0;
  local_348.testCases.passed = 0;
  local_348.testCases.failed = 0;
  local_348.testCases.failedButOk = 0;
  local_348.skippedTestReasons._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_348.skippedTestReasons._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_348.skippedTestReasons._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  (**(code **)(*(long *)local_2d0._0_8_ + 0x20))(local_3b8);
  RunContext::testGroupStarting((RunContext *)(local_2d0 + 0x10),(string *)local_3b8,1,1);
  local_3f0 = (vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
               *)lVar18;
  if ((pointer)local_3b8._0_8_ != (pointer)local_3a8) {
    operator_delete((void *)local_3b8._0_8_);
  }
  total_tests = local_78._40_4_;
  iVar10 = (**(code **)(*(long *)local_2d0._0_8_ + 0x98))();
  if (iVar10 < 0) {
    iVar10 = (**(code **)(*(long *)local_2d0._0_8_ + 0xa0))();
    if (iVar10 < 0) {
      iVar10 = 0;
    }
    else {
      iVar10 = (**(code **)(*(long *)local_2d0._0_8_ + 0xa0))();
      iVar10 = (int)((double)(int)total_tests * ((double)iVar10 / 100.0));
    }
  }
  else {
    iVar10 = (**(code **)(*(long *)local_2d0._0_8_ + 0x98))();
  }
  iVar11 = (**(code **)(*(long *)local_2d0._0_8_ + 0xa8))();
  if (iVar11 < 0) {
    iVar24 = (**(code **)(*(long *)local_2d0._0_8_ + 0xb0))();
    iVar11 = total_tests;
    if (-1 < iVar24) {
      iVar11 = (**(code **)(*(long *)local_2d0._0_8_ + 0xb0))();
      iVar11 = (int)((double)(int)total_tests * ((double)iVar11 / 100.0));
    }
  }
  else {
    iVar11 = (**(code **)(*(long *)local_2d0._0_8_ + 0xa8))();
  }
  peVar22 = (element_type *)local_78._48_8_;
  peVar25 = (element_type *)local_78._56_8_;
  if ((_Base_ptr)local_78._24_8_ != __position._M_node) {
    iVar24 = 0;
    p_Var19 = (_Base_ptr)local_78._24_8_;
    do {
      uVar9 = local_1b8;
      iVar12 = (**(code **)(*local_1e0 + 0x48))();
      if (uVar9 < (ulong)(long)iVar12) {
        if ((iVar24 < iVar10) || (iVar11 <= iVar24)) {
          iVar24 = iVar24 + 1;
        }
        else {
          local_410._0_8_ = local_410 + 0x10;
          lVar18 = **(long **)(p_Var19 + 1);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_410,lVar18,(*(long **)(p_Var19 + 1))[1] + lVar18);
          anon_unknown_1::renderTestProgress(iVar24,total_tests,(string *)local_410);
          if ((IStreamingReporter *)local_410._0_8_ != (IStreamingReporter *)(local_410 + 0x10)) {
            operator_delete((void *)local_410._0_8_);
          }
          RunContext::runTest((Totals *)local_3b8,(RunContext *)(local_2d0 + 0x10),
                              *(TestCase **)(p_Var19 + 1));
          Totals::operator+=(&local_348,(Totals *)local_3b8);
          clara::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                       *)(local_3a8 + 0x30));
          iVar24 = iVar24 + 1;
          if (iVar24 == total_tests) {
            local_3e8._0_8_ = local_3e8 + 0x10;
            lVar18 = **(long **)(p_Var19 + 1);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_3e8,lVar18,(*(long **)(p_Var19 + 1))[1] + lVar18);
            anon_unknown_1::renderTestProgress(total_tests,total_tests,(string *)local_3e8);
            if ((IStreamingReporter *)local_3e8._0_8_ != (IStreamingReporter *)(local_3e8 + 0x10)) {
              operator_delete((void *)local_3e8._0_8_);
            }
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
            std::ostream::put('@');
            std::ostream::flush();
            iVar24 = total_tests;
          }
        }
      }
      else {
        (**(code **)(*local_160 + 0x78))(local_160,*(undefined8 *)(p_Var19 + 1));
      }
      p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19);
      peVar22 = (element_type *)local_78._48_8_;
      peVar25 = (element_type *)local_78._56_8_;
    } while (p_Var19 != __position._M_node);
  }
  for (; peVar22 != peVar25;
      peVar22 = (element_type *)&(peVar22->m_data).benchmarkConfidenceInterval) {
    lVar18._0_4_ = (peVar22->m_data).startOffsetPercentage;
    lVar18._4_4_ = (peVar22->m_data).endOffset;
    lVar15._0_4_ = (peVar22->m_data).endOffsetPercentage;
    lVar15._4_1_ = (peVar22->m_data).outputSQL;
    lVar15._5_1_ = (peVar22->m_data).benchmarkNoAnalysis;
    lVar15._6_2_ = *(undefined2 *)&(peVar22->m_data).field_0x26;
    if (lVar18 == lVar15) {
      (**(code **)(*local_160 + 0x18))(local_160,peVar22);
      local_348.error = 0xffffffff;
    }
  }
  lVar15 = *(long *)((long)local_3f0 + 0x20);
  for (lVar18 = *(long *)((long)local_3f0 + 0x18); lVar18 != lVar15; lVar18 = lVar18 + 0x20) {
    (**(code **)(*local_160 + 0x20))(local_160,lVar18);
  }
  (**(code **)(*(long *)local_2d0._0_8_ + 0x20))(local_3b8);
  RunContext::testGroupEnded((RunContext *)(local_2d0 + 0x10),(string *)local_3b8,&local_348,1,1);
  psVar7 = local_3c0;
  if ((pointer)local_3b8._0_8_ != (pointer)local_3a8) {
    operator_delete((void *)local_3b8._0_8_);
  }
  iVar11 = (*(((psVar7->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             super_IConfig).super_NonCopyable._vptr_NonCopyable[8])();
  iVar10 = 2;
  if (((byte)iVar11 & local_348.error == -1) == 0) {
    iVar10 = (int)local_348.assertions.failed;
    if ((int)local_348.assertions.failed < local_348.error) {
      iVar10 = local_348.error;
    }
    if (0xfe < iVar10) {
      iVar10 = 0xff;
    }
  }
  clara::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)((long)&local_348 + 0x40));
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
          (local_78 + 0x30));
  clara::std::
  _Rb_tree<const_Catch::TestCase_*,_const_Catch::TestCase_*,_std::_Identity<const_Catch::TestCase_*>,_std::less<const_Catch::TestCase_*>,_std::allocator<const_Catch::TestCase_*>_>
  ::~_Rb_tree((_Rb_tree<const_Catch::TestCase_*,_const_Catch::TestCase_*,_std::_Identity<const_Catch::TestCase_*>,_std::less<const_Catch::TestCase_*>,_std::allocator<const_Catch::TestCase_*>_>
               *)local_78);
  RunContext::~RunContext((RunContext *)(local_2d0 + 0x10));
  if ((element_type *)local_2d0._8_8_ != (element_type *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d0._8_8_);
  }
  return iVar10;
}

Assistant:

int Session::runInternal() {
        if( m_startupExceptions )
            return 1;

        if (m_configData.showHelp || m_configData.libIdentify) {
            return 0;
        }

        CATCH_TRY {
            config(); // Force config to be constructed

            seedRng( *m_config );

            if( m_configData.filenamesAsTags )
                applyFilenamesAsTags( *m_config );

            // Handle list request
            if( Option<std::size_t> listed = list( m_config ) )
                return static_cast<int>( *listed );

            TestGroup tests { m_config };
            auto const totals = tests.execute();

            if( m_config->warnAboutNoTests() && totals.error == -1 )
                return 2;

            // Note that on unices only the lower 8 bits are usually used, clamping
            // the return value to 255 prevents false negative when some multiple
            // of 256 tests has failed
            return (std::min) (MaxExitCode, (std::max) (totals.error, static_cast<int>(totals.assertions.failed)));
        }